

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int glslang::TIntermediate::computeBufferReferenceTypeSize(TType *type)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  
  iVar2 = (*type->_vptr_TType[7])();
  if (iVar2 == 0x12) {
    iVar2 = (*type->_vptr_TType[0x15])(type);
    uVar3 = getBlockSize((TType *)CONCAT44(extraout_var,iVar2));
    uVar4 = TType::getBufferReferenceAlignment(type);
    uVar1 = -uVar4 & (uVar3 + uVar4) - 1;
    if (uVar4 == 0) {
      uVar1 = uVar3;
    }
    return uVar1;
  }
  __assert_fail("type.isReference()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                ,0x9c5,
                "static int glslang::TIntermediate::computeBufferReferenceTypeSize(const TType &)");
}

Assistant:

int TIntermediate::computeBufferReferenceTypeSize(const TType& type)
{
    assert(type.isReference());
    int size = getBlockSize(*type.getReferentType());

    int align = type.getBufferReferenceAlignment();

    if (align) {
        size = (size + align - 1) & ~(align-1);
    }

    return size;
}